

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnReturnCallIndirect
          (TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  bool bVar1;
  Result RVar2;
  Label *local_40;
  Label *func_label;
  Result local_2c;
  TypeVector *pTStack_28;
  Result result;
  TypeVector *result_types_local;
  TypeVector *param_types_local;
  TypeChecker *this_local;
  
  pTStack_28 = result_types;
  Type::Type((Type *)((long)&func_label + 4),I32);
  local_2c = PopAndCheck1Type(this,stack0xffffffffffffffcc,"return_call_indirect");
  func_label._0_4_ = PopAndCheckSignature(this,param_types,"return_call_indirect");
  Result::operator|=(&local_2c,func_label._0_4_);
  RVar2 = GetThisFunctionLabel(this,&local_40);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = CheckReturnSignature(this,pTStack_28,&local_40->result_types,"return_call_indirect");
    Result::operator|=(&local_2c,RVar2);
    RVar2 = SetUnreachable(this);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      this_local._4_4_ = local_2c.enum_;
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnReturnCallIndirect(const TypeVector& param_types,
                                         const TypeVector& result_types) {
  Result result = PopAndCheck1Type(Type::I32, "return_call_indirect");

  result |= PopAndCheckSignature(param_types, "return_call_indirect");
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= CheckReturnSignature(result_types, func_label->result_types,
                                 "return_call_indirect");

  CHECK_RESULT(SetUnreachable());
  return result;
}